

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  String local_50 [2];
  String local_30;
  CharFormat local_1c;
  ostream *poStack_18;
  CharFormat format;
  ostream *os_local;
  uchar c_local;
  
  poStack_18 = os;
  os_local._7_1_ = c;
  std::operator<<(os,"\'");
  local_1c = PrintAsCharLiteralTo<unsigned_char,unsigned_char>(os_local._7_1_,poStack_18);
  std::operator<<(poStack_18,"\'");
  if (os_local._7_1_ != 0) {
    poVar1 = std::operator<<(poStack_18," (");
    String::Format(&local_30,"%d",(ulong)os_local._7_1_);
    pcVar2 = String::c_str(&local_30);
    std::operator<<(poVar1,pcVar2);
    String::~String(&local_30);
    poVar1 = poStack_18;
    if ((local_1c != kHexEscape) && ((os_local._7_1_ == 0 || (9 < os_local._7_1_)))) {
      String::Format(local_50,", 0x%X",(ulong)os_local._7_1_);
      pcVar2 = String::c_str(local_50);
      std::operator<<(poVar1,pcVar2);
      String::~String(local_50);
    }
    std::operator<<(poStack_18,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << String::Format("%d", c).c_str();

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << String::Format(", 0x%X",
                          static_cast<UnsignedChar>(c)).c_str();
  }
  *os << ")";
}